

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O2

vm_obj_id_t
CVmObjIterIdx::create_for_coll(vm_val_t *coll,long first_valid_index,long last_valid_index)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t obj_id;
  CVmObjIterIdx *this;
  
  pvVar3 = sp_;
  uVar2 = *(undefined4 *)&coll->field_0x4;
  aVar1 = coll->val;
  sp_ = sp_ + 1;
  pvVar3->typ = coll->typ;
  *(undefined4 *)&pvVar3->field_0x4 = uVar2;
  pvVar3->val = aVar1;
  obj_id = vm_new_id(0,1,0);
  this = (CVmObjIterIdx *)CVmObject::operator_new(0x10,obj_id);
  CVmObjIterIdx(this,coll,first_valid_index,last_valid_index);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjIterIdx::create_for_coll(VMG_ const vm_val_t *coll,
                                           long first_valid_index,
                                           long last_valid_index)
{
    vm_obj_id_t id;

    /* push the collection object reference for gc protection */
    G_stk->push(coll);

    /* create a non-root-set object */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the iterator */
    new (vmg_ id) CVmObjIterIdx(vmg_ coll, first_valid_index,
                                last_valid_index);

    /* done with the gc protection */
    G_stk->discard();

    /* return the new object's ID */
    return id;
}